

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LEB128.h
# Opt level: O0

uint64_t decodeULEB128(uint8_t *p,uint *n)

{
  byte bVar1;
  uint8_t *puVar2;
  uint Shift;
  uint64_t Value;
  uint8_t *orig_p;
  uint *n_local;
  uint8_t *p_local;
  
  Value = 0;
  Shift = 0;
  p_local = p;
  do {
    Value = ((long)(int)(*p_local & 0x7f) << ((byte)Shift & 0x3f)) + Value;
    Shift = Shift + 7;
    puVar2 = p_local + 1;
    bVar1 = *p_local;
    p_local = puVar2;
  } while (0x7f < bVar1);
  if (n != (uint *)0x0) {
    *n = (int)puVar2 - (int)p;
  }
  return Value;
}

Assistant:

static inline uint64_t decodeULEB128(const uint8_t *p, unsigned *n)
{
	const uint8_t *orig_p = p;
	uint64_t Value = 0;
	unsigned Shift = 0;
	do {
		Value += (uint64_t)(*p & 0x7f) << Shift;
		Shift += 7;
	} while (*p++ >= 128);
	if (n)
		*n = (unsigned)(p - orig_p);
	return Value;
}